

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void icetStateDestroy(IceTState state)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((*(int *)((long)&state->type + lVar2) != 0) &&
       (0 < *(int *)((long)&state->num_entries + lVar2))) {
      puVar1 = (undefined8 *)((long)&state->type + lVar2);
      free(*(void **)((long)&state->data + lVar2));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x3000);
  free(state);
  return;
}

Assistant:

void icetStateDestroy(IceTState state)
{
    IceTEnum pname;

    for (pname = ICET_STATE_ENGINE_START;
         pname < ICET_STATE_ENGINE_END;
         pname++) {
        stateFree(pname, state);
    }
    free(state);
}